

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O0

SColor __thiscall irr::video::SColorf::toSColor(SColorf *this)

{
  u32 a;
  u32 r;
  u32 g;
  u32 b;
  SColor local_4;
  
  a = core::round32(0.0);
  r = core::round32(0.0);
  g = core::round32(0.0);
  b = core::round32(0.0);
  SColor::SColor(&local_4,a,r,g,b);
  return (SColor)local_4.color;
}

Assistant:

SColor toSColor() const
	{
		return SColor((u32)core::round32(a * 255.0f), (u32)core::round32(r * 255.0f), (u32)core::round32(g * 255.0f), (u32)core::round32(b * 255.0f));
	}